

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O1

void * load_image_fn(sexp ctx,sexp dl,sexp name)

{
  char *pcVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  sexp_proc2 p_Var5;
  long lVar6;
  int iVar7;
  sexp psVar8;
  size_t __n;
  void *pvVar9;
  sexp psVar10;
  char *pcVar11;
  char *pcVar12;
  
  psVar2 = (name->value).type.name;
  psVar3 = (name->value).type.cpl;
  if ((((ulong)dl & 3) == 0 && dl != (sexp)0x0) && (dl->tag == 0x1a)) {
    if ((dl->value).type.cpl == (sexp)0x0) {
      psVar10 = (dl->value).type.name;
      psVar4 = (psVar10->value).type.name;
      psVar10 = (psVar10->value).type.cpl;
      pcVar12 = (psVar10->value).flonum_bits + (long)(psVar4->value).flonum_bits;
      psVar8 = (sexp)dlopen(pcVar12,1);
      (dl->value).type.cpl = psVar8;
      if (psVar8 == (sexp)0x0) {
        for (p_Var5 = (((ctx->value).type.setters)->value).type.finalize;
            (((ulong)p_Var5 & 3) == 0 && (*(int *)p_Var5 == 6));
            p_Var5 = *(sexp_proc2 *)(p_Var5 + 0x10)) {
          lVar6 = *(long *)(p_Var5 + 8);
          pcVar11 = (char *)(*(long *)(lVar6 + 8) + *(long *)(lVar6 + 0x10) + 0x10);
          __n = strlen(pcVar11);
          iVar7 = strncmp(pcVar12,pcVar11,__n);
          if (iVar7 == 0) {
            pcVar11 = (psVar4->value).flonum_bits +
                      (long)(&psVar10->field_0x7 + *(long *)(lVar6 + 0x18));
            do {
              pcVar1 = pcVar11 + 1;
              pcVar11 = pcVar11 + 1;
            } while (*pcVar1 == '/');
            pcVar11 = sexp_find_module_file_raw(ctx,pcVar11);
            if (pcVar11 != (char *)0x0) {
              psVar8 = (sexp)dlopen(pcVar11,1);
              (dl->value).type.cpl = psVar8;
              free(pcVar11);
              if ((dl->value).type.cpl != (sexp)0x0) break;
            }
          }
        }
        if ((dl->value).type.cpl == (sexp)0x0) {
          psVar2 = (dl->value).type.name;
          snprintf(gc_heap_err_str,0x100,"dlopen failure: %s",
                   (long)&((psVar2->value).type.cpl)->value +
                   (long)&((psVar2->value).type.name)->value);
          return (void *)0x0;
        }
      }
    }
    psVar10 = (dl->value).type.cpl;
  }
  else {
    psVar10 = (sexp)0x0;
  }
  pcVar12 = (psVar3->value).flonum_bits + 8 + (long)psVar2;
  pvVar9 = (void *)dlsym(psVar10,pcVar12);
  if (pvVar9 == (void *)0x0) {
    snprintf(gc_heap_err_str,0x100,"dynamic function lookup failure: %s %s","<static>",pcVar12);
  }
  return pvVar9;
}

Assistant:

static void* load_image_fn(sexp ctx, sexp dl, sexp name) {
  sexp ls;
  void *fn = NULL;
  char *file_name, *rel_name=NULL, *new_file_name;
  char *handle_name = "<static>";
  char *symbol_name = sexp_string_data(name);
  if (dl && sexp_dlp(dl)) {
    if (!sexp_dl_handle(dl)) {
      /* try exact file, then the search path */
      file_name = sexp_string_data(sexp_dl_file(dl));
      sexp_dl_handle(dl) = dlopen(file_name, RTLD_LAZY);
      if (!sexp_dl_handle(dl)) {
        for (ls = sexp_global(ctx, SEXP_G_MODULE_PATH); sexp_pairp(ls); ls=sexp_cdr(ls)) {
          if (strstr(file_name, sexp_string_data(sexp_car(ls))) == file_name) {
            rel_name = file_name + sexp_string_size(sexp_car(ls));
            while (*rel_name == '/')
              ++rel_name;
            new_file_name = sexp_find_module_file_raw(ctx, rel_name);
            if (new_file_name) {
              sexp_dl_handle(dl) = dlopen(new_file_name, RTLD_LAZY);
              free(new_file_name);
              if (sexp_dl_handle(dl))
                break;
            }
          }
        }
        if (!sexp_dl_handle(dl)) {
          handle_name = sexp_string_data(sexp_dl_file(dl));
          snprintf(gc_heap_err_str, ERR_STR_SIZE, "dlopen failure: %s",
                   handle_name);
          return NULL;
        }
      }
    }
    fn = dlsym(sexp_dl_handle(dl), symbol_name);
  } else {
    fn = dlsym(SEXP_RTLD_DEFAULT, symbol_name);
  }
  if (!fn) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE,
             "dynamic function lookup failure: %s %s",
             handle_name, symbol_name);
  }
  return fn;
}